

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VtabImportErrmsg(Vdbe *p,sqlite3_vtab *pVtab)

{
  sqlite3 *db;
  char *pcVar1;
  
  if (pVtab->zErrMsg != (char *)0x0) {
    db = p->db;
    sqlite3DbFree(db,p->zErrMsg);
    pcVar1 = sqlite3DbStrDup(db,pVtab->zErrMsg);
    p->zErrMsg = pcVar1;
    sqlite3_free(pVtab->zErrMsg);
    pVtab->zErrMsg = (char *)0x0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabImportErrmsg(Vdbe *p, sqlite3_vtab *pVtab){
  if( pVtab->zErrMsg ){
    sqlite3 *db = p->db;
    sqlite3DbFree(db, p->zErrMsg);
    p->zErrMsg = sqlite3DbStrDup(db, pVtab->zErrMsg);
    sqlite3_free(pVtab->zErrMsg);
    pVtab->zErrMsg = 0;
  }
}